

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalWrapper.cpp
# Opt level: O1

Expression * __thiscall IRT::ConditionalWrapper::ToExpression(ConditionalWrapper *this)

{
  int iVar1;
  TempExpression *this_00;
  MoveStatement *this_01;
  ConstExpression *pCVar2;
  undefined4 extraout_var;
  MoveStatement *this_02;
  undefined1 local_138 [8];
  Label label_false;
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  Label local_d8;
  Label local_b8;
  EseqExpression *local_98;
  SeqStatement *local_90;
  LabelStatement *local_88;
  SeqStatement *local_80;
  SeqStatement *local_78;
  SeqStatement *local_70;
  LabelStatement *local_68;
  undefined1 local_60 [8];
  Label label_true;
  
  this_00 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary((Temporary *)local_60);
  TempExpression::TempExpression(this_00,(Temporary *)local_60);
  if (local_60 != (undefined1  [8])&label_true.label_._M_string_length) {
    operator_delete((void *)local_60,label_true.label_._M_string_length + 1);
  }
  Label::Label((Label *)local_60);
  Label::Label((Label *)local_138);
  local_98 = (EseqExpression *)operator_new(0x18);
  local_90 = (SeqStatement *)operator_new(0x18);
  this_01 = (MoveStatement *)operator_new(0x18);
  pCVar2 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar2,1);
  MoveStatement::MoveStatement(this_01,(Expression *)this_00,(Expression *)pCVar2);
  local_80 = (SeqStatement *)operator_new(0x18);
  label_false.label_.field_2._8_8_ = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&label_false.label_.field_2 + 8),local_60,
             label_true.label_._M_dataplus._M_p + (long)local_60);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,local_138,label_false.label_._M_dataplus._M_p + (long)local_138);
  iVar1 = (*(this->super_SubtreeWrapper)._vptr_SubtreeWrapper[4])
                    (this,(undefined1 *)((long)&label_false.label_.field_2 + 8),local_f8);
  local_78 = (SeqStatement *)operator_new(0x18);
  local_88 = (LabelStatement *)operator_new(0x28);
  local_d8.label_._M_dataplus._M_p = (pointer)&local_d8.label_.field_2;
  label_true.label_.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_138,label_false.label_._M_dataplus._M_p + (long)local_138);
  LabelStatement::LabelStatement(local_88,&local_d8);
  local_70 = (SeqStatement *)operator_new(0x18);
  this_02 = (MoveStatement *)operator_new(0x18);
  pCVar2 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar2,0);
  MoveStatement::MoveStatement(this_02,(Expression *)this_00,(Expression *)pCVar2);
  local_68 = (LabelStatement *)operator_new(0x28);
  local_b8.label_._M_dataplus._M_p = (pointer)&local_b8.label_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_60,label_true.label_._M_dataplus._M_p + (long)local_60);
  LabelStatement::LabelStatement(local_68,&local_b8);
  SeqStatement::SeqStatement(local_70,(Statement *)this_02,&local_68->super_Statement);
  SeqStatement::SeqStatement(local_78,&local_88->super_Statement,&local_70->super_Statement);
  SeqStatement::SeqStatement
            (local_80,(Statement *)label_true.label_.field_2._8_8_,&local_78->super_Statement);
  SeqStatement::SeqStatement(local_90,(Statement *)this_01,&local_80->super_Statement);
  EseqExpression::EseqExpression(local_98,&local_90->super_Statement,(Expression *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.label_._M_dataplus._M_p != &local_b8.label_.field_2) {
    operator_delete(local_b8.label_._M_dataplus._M_p,
                    local_b8.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.label_._M_dataplus._M_p != &local_d8.label_.field_2) {
    operator_delete(local_d8.label_._M_dataplus._M_p,
                    local_d8.label_.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if ((long *)label_false.label_.field_2._8_8_ != local_108) {
    operator_delete((void *)label_false.label_.field_2._8_8_,local_108[0] + 1);
  }
  if (local_138 != (undefined1  [8])&label_false.label_._M_string_length) {
    operator_delete((void *)local_138,label_false.label_._M_string_length + 1);
  }
  if (local_60 != (undefined1  [8])&label_true.label_._M_string_length) {
    operator_delete((void *)local_60,label_true.label_._M_string_length + 1);
  }
  return &local_98->super_Expression;
}

Assistant:

Expression *IRT::ConditionalWrapper::ToExpression() {
    auto* temp_expression = new TempExpression(Temporary());
    Label label_true;
    Label label_false;
    return new EseqExpression(
      new SeqStatement(
        new MoveStatement(temp_expression, new ConstExpression(1)),
        new SeqStatement(
          ToConditional(label_true, label_false),
          new SeqStatement(
            new LabelStatement(label_false),
            new SeqStatement(
              new MoveStatement(temp_expression, new ConstExpression(0)),
              new LabelStatement(label_true)
            )
          )
        )
      ),
      temp_expression
    );
}